

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O1

void __thiscall
QAnimationGroup::removeAnimation(QAnimationGroup *this,QAbstractAnimation *animation)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  
  if (animation == (QAbstractAnimation *)0x0) {
    removeAnimation();
    return;
  }
  lVar5 = *(long *)(this + 8);
  plVar1 = (long *)(lVar5 + 0xb0);
  if (*plVar1 != 0) {
    plVar2 = (long *)(lVar5 + 0xa8);
    lVar6 = -8;
    do {
      lVar3 = *plVar1 * -8 + lVar6;
      if (lVar3 == -8) goto LAB_003b3569;
      lVar5 = lVar6 + 8;
      plVar4 = (long *)(*plVar2 + 8 + lVar6);
      lVar6 = lVar5;
    } while ((QAbstractAnimation *)*plVar4 != animation);
    lVar5 = lVar5 >> 3;
LAB_003b3569:
    if (lVar3 != -8) goto LAB_003b3576;
  }
  lVar5 = -1;
LAB_003b3576:
  if (lVar5 == -1) {
    removeAnimation();
    return;
  }
  takeAnimation(this,(int)lVar5);
  return;
}

Assistant:

void QAnimationGroup::removeAnimation(QAbstractAnimation *animation)
{
    Q_D(QAnimationGroup);

    if (!animation) {
        qWarning("QAnimationGroup::remove: cannot remove null animation");
        return;
    }
    qsizetype index = d->animations.indexOf(animation);
    if (index == -1) {
        qWarning("QAnimationGroup::remove: animation is not part of this group");
        return;
    }

    takeAnimation(index);
}